

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int mem_av_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t dst;
  int iVar1;
  in_edge_t_conflict elem;
  bitmap_t prev_mem_av_in;
  edge_t_conflict head;
  edge_t_conflict e;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  dst = gen_ctx->temp_bitmap;
  bitmap_copy(dst,bb->in);
  elem = DLIST_in_edge_t_head(&bb->in_edges);
  bitmap_copy(bb->in,elem->src->out);
  for (head = DLIST_in_edge_t_next(elem); head != (edge_t_conflict)0x0;
      head = DLIST_in_edge_t_next(head)) {
    bitmap_and(bb->in,bb->in,head->src->out);
  }
  iVar1 = bitmap_equal_p(bb->in,dst);
  return (int)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static int mem_av_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, head;
  bitmap_t prev_mem_av_in = temp_bitmap;

  bitmap_copy (prev_mem_av_in, bb->mem_av_in);
  head = DLIST_HEAD (in_edge_t, bb->in_edges);
  bitmap_copy (bb->mem_av_in, head->src->mem_av_out);
  for (e = DLIST_NEXT (in_edge_t, head); e != NULL; e = DLIST_NEXT (in_edge_t, e))
    bitmap_and (bb->mem_av_in, bb->mem_av_in, e->src->mem_av_out); /* mem_av_in &= mem_av_out */
  return !bitmap_equal_p (bb->mem_av_in, prev_mem_av_in);
}